

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

void __thiscall cfd::core::ByteData::ByteData(ByteData *this,uint8_t *buffer,uint32_t size)

{
  CfdException *this_00;
  ulong __n;
  string local_48;
  
  __n = (ulong)size;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data_,__n,(allocator_type *)&local_48);
  if (buffer == (uint8_t *)0x0) {
    if (size != 0) {
      local_48._M_dataplus._M_p = "cfdcore_bytedata.cpp";
      local_48._M_string_length._0_4_ = 0x46;
      local_48.field_2._M_allocated_capacity = (long)"Hash160ByteData" + 7;
      logger::log<>((CfdSourceLocation *)&local_48,kCfdLogLevelWarning,"buffer is null.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"buffer is null.","");
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else if (size != 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,__n);
    memcpy((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,buffer,__n);
  }
  return;
}

Assistant:

ByteData::ByteData(const uint8_t* buffer, uint32_t size) : data_(size) {
  if (buffer == nullptr) {
    if (size == 0) {
      // create empty buffer
    } else {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(kCfdIllegalArgumentError, "buffer is null.");
    }
  } else if (size != 0) {
    data_.resize(size);
    memcpy(data_.data(), buffer, size);
  }
}